

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkSweepBufsInvs(Abc_Ntk_t *pNtk,int fVerbose)

{
  Hop_Man_t *p;
  Abc_Obj_t *p_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Abc_Obj_t *pObj;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pHVar6;
  ulong uVar7;
  uint nCapMin;
  long lVar8;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x3ce,"int Abc_NtkSweepBufsInvs(Abc_Ntk_t *, int)");
  }
  iVar2 = Abc_NtkToAig(pNtk);
  if (iVar2 == 0) {
    fwrite("Converting to SOP has failed.\n",0x1e,1,_stdout);
    iVar2 = 1;
  }
  else {
    p = (Hop_Man_t *)pNtk->pManFunc;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      nCapMin = pNtk->vObjs->nSize + 500;
      Vec_IntGrow(&pNtk->vTravIds,nCapMin);
      uVar4 = 0;
      uVar7 = 0;
      if (0 < (int)nCapMin) {
        uVar7 = (ulong)nCapMin;
      }
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        (pNtk->vTravIds).pArray[uVar4] = 0;
      }
      (pNtk->vTravIds).nSize = nCapMin;
    }
    iVar2 = pNtk->nTravIds;
    pNtk->nTravIds = iVar2 + 1;
    if (0x3ffffffe < iVar2) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    uVar4 = 0;
    bVar1 = true;
    while (iVar2 = (int)uVar4, bVar1) {
      bVar1 = false;
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        pObj = Abc_NtkObj(pNtk,iVar2);
        if (pObj != (Abc_Obj_t *)0x0) {
          for (lVar8 = 0; lVar8 < (pObj->vFanins).nSize; lVar8 = lVar8 + 1) {
            p_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]];
            iVar3 = Abc_NodeIsTravIdCurrent(p_00);
            if ((((iVar3 == 0) && ((*(uint *)&p_00->field_0x14 & 0xf) == 7)) &&
                ((p_00->vFanins).nSize == 1)) &&
               (((*(uint *)&pObj->field_0x14 & 0xf) - 5 < 0xfffffffe ||
                (iVar3 = Abc_NodeIsInv(p_00), iVar3 == 0)))) {
              iVar3 = Abc_NodeIsInv(p_00);
              if (iVar3 != 0) {
                pHVar6 = (Hop_Obj_t *)(pObj->field_5).pData;
                pHVar5 = Hop_IthVar(p,(int)lVar8);
                pHVar6 = Hop_Compose(p,pHVar6,(Hop_Obj_t *)((ulong)pHVar5 ^ 1),(int)lVar8);
                (pObj->field_5).pData = pHVar6;
              }
              uVar4 = (ulong)((int)uVar4 + 1);
              Abc_ObjPatchFanin(pObj,p_00,
                                (Abc_Obj_t *)p_00->pNtk->vObjs->pArray[*(p_00->vFanins).pArray]);
              if ((p_00->vFanouts).nSize == 0) {
                Abc_NtkDeleteObj(p_00);
              }
              bVar1 = true;
            }
          }
        }
      }
    }
    if (fVerbose != 0) {
      printf("Removed %d single input nodes.\n",uVar4);
    }
  }
  return iVar2;
}

Assistant:

int Abc_NtkSweepBufsInvs( Abc_Ntk_t * pNtk, int fVerbose )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, fChanges = 1, Counter = 0;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 1;
    }
    // get AIG manager
    pMan = (Hop_Man_t *)pNtk->pManFunc;
    // label selected nodes
    Abc_NtkIncrementTravId( pNtk );
    // iterate till no improvement
    while ( fChanges )
    {
        fChanges = 0;
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            Abc_ObjForEachFanin( pObj, pFanin, k )
            {
                // do not eliminate marked fanins
                if ( Abc_NodeIsTravIdCurrent(pFanin) )
                    continue;
                // do not eliminate constant nodes
                if ( !Abc_ObjIsNode(pFanin) || Abc_ObjFaninNum(pFanin) != 1 )
                    continue;
                // do not eliminate inverters into COs
                if ( Abc_ObjIsCo(pObj) && Abc_NodeIsInv(pFanin) )
                    continue;
                // do not eliminate buffers connecting PIs and POs 
//                if ( Abc_ObjIsCo(pObj) && Abc_ObjIsCi(Abc_ObjFanin0(pFanin)) )
//                    continue;
                fChanges = 1;
                Counter++;
                // update function of the node
                if ( Abc_NodeIsInv(pFanin) )
                    pObj->pData = Hop_Compose( pMan, (Hop_Obj_t *)pObj->pData, Hop_Not(Hop_IthVar(pMan, k)), k );
                // update the fanin
                Abc_ObjPatchFanin( pObj, pFanin, Abc_ObjFanin0(pFanin) );
                if ( Abc_ObjFanoutNum(pFanin) == 0 )
                    Abc_NtkDeleteObj(pFanin);            
            }
        }
    }
    if ( fVerbose )
        printf( "Removed %d single input nodes.\n", Counter );
    return Counter;
}